

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_query(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData,
           int parseSeparator)

{
  size_t sVar1;
  size_t sVar2;
  size_t previousOffset_1;
  curi_status tryStatus;
  size_t previousOffset;
  size_t queryStartOffset;
  curi_status status;
  int parseSeparator_local;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  queryStartOffset._0_4_ = curi_status_success;
  if (parseSeparator != 0) {
    queryStartOffset._0_4_ = parse_char('?',uri,len,offset,settings,userData);
  }
  sVar1 = *offset;
  if ((curi_status)queryStartOffset == curi_status_success) {
    if ((((settings->query_item_null_callback == (_func_int_void_ptr_char_ptr_size_t *)0x0) &&
         (settings->query_item_int_callback == (_func_int_void_ptr_char_ptr_size_t_long *)0x0)) &&
        (settings->query_item_double_callback == (_func_int_void_ptr_char_ptr_size_t_double *)0x0))
       && (settings->query_item_str_callback ==
           (_func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *)0x0)) {
      while ((curi_status)queryStartOffset == curi_status_success) {
        sVar2 = *offset;
        queryStartOffset._0_4_ = parse_query_fragment_char(uri,len,offset,settings,userData);
        if ((curi_status)queryStartOffset != curi_status_success) {
          *offset = sVar2;
        }
      }
      queryStartOffset._0_4_ = curi_status_success;
    }
    else {
      queryStartOffset._0_4_ = parse_query_item(uri,len,offset,settings,userData);
      if ((curi_status)queryStartOffset == curi_status_success) {
        previousOffset_1._4_4_ = curi_status_success;
        while (previousOffset_1._4_4_ == curi_status_success) {
          sVar2 = *offset;
          previousOffset_1._4_4_ =
               parse_char(settings->query_item_separator,uri,len,offset,settings,userData);
          if (previousOffset_1._4_4_ == curi_status_success) {
            previousOffset_1._4_4_ = parse_query_item(uri,len,offset,settings,userData);
          }
          if (previousOffset_1._4_4_ == curi_status_error) {
            *offset = sVar2;
          }
          else {
            queryStartOffset._0_4_ = previousOffset_1._4_4_;
          }
        }
      }
    }
  }
  if ((curi_status)queryStartOffset == curi_status_success) {
    queryStartOffset._0_4_ = handle_query(uri + sVar1,*offset - sVar1,settings,userData);
  }
  return (curi_status)queryStartOffset;
}

Assistant:

static curi_status parse_query(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData, int parseSeparator)
{
    // If not interested in individual items,
    //      query = "?" *query_fragment_char
    // if interested,
    //      query = "?" query_item *(query_item_separator query_item)
    //      query_item_separator = settings->query_item_separator (default is "&")

    curi_status status = curi_status_success;

    size_t queryStartOffset;

    if (parseSeparator && status == curi_status_success)
        status = parse_char('?', uri, len, offset, settings, userData);

    queryStartOffset = *offset;

    if (status == curi_status_success)
    {
        if (!settings->query_item_null_callback && !settings->query_item_int_callback && !settings->query_item_double_callback && !settings->query_item_str_callback)
        {
            while (status == curi_status_success)
            {
                size_t previousOffset = *offset;

                status = parse_query_fragment_char(uri, len, offset, settings, userData);

                if (status != curi_status_success)
                    *offset = previousOffset;
            }

            status = curi_status_success;
        }
        else
        {
            status = parse_query_item(uri, len, offset, settings, userData);

            if (status == curi_status_success)
            {
                curi_status tryStatus = curi_status_success;
                while (tryStatus == curi_status_success)
                {
                    size_t previousOffset = *offset;

                    tryStatus = parse_char(settings->query_item_separator, uri, len, offset, settings, userData);

                    if (tryStatus == curi_status_success)
                        tryStatus = parse_query_item(uri, len, offset, settings, userData);

                    if (tryStatus == curi_status_error)
                        *offset = previousOffset;
                    else
                        status = tryStatus;
                }
            }
        }
    }

    if (status == curi_status_success)
        status = handle_query(uri + queryStartOffset, *offset - queryStartOffset, settings, userData);

    return status;
}